

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O0

ssize_t __thiscall
twitter::zipkin::thrift::Annotation::write(Annotation *this,int __fd,void *__buf,size_t __n)

{
  uint32_t uVar1;
  uint uVar2;
  ssize_t sVar3;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *prot;
  TOutputRecursionTracker local_28;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  TProtocol *oprot_local;
  Annotation *this_local;
  
  prot = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  tracker.prot_._4_4_ = 0;
  apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker(&local_28,prot);
  uVar1 = apache::thrift::protocol::TProtocol::writeStructBegin(prot,"Annotation");
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeFieldBegin(prot,"timestamp",T_I64,1);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeI64(prot,this->timestamp);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeFieldEnd(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeFieldBegin(prot,"value",T_STRING,2);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeString(prot,&this->value);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeFieldEnd(prot);
  tracker.prot_._4_4_ = uVar1 + tracker.prot_._4_4_;
  if (((byte)this->__isset >> 2 & 1) != 0) {
    uVar1 = apache::thrift::protocol::TProtocol::writeFieldBegin(prot,"host",T_STRUCT,3);
    tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
    sVar3 = Endpoint::write(&this->host,__fd,__buf_00,(ulong)uVar1);
    tracker.prot_._4_4_ = tracker.prot_._4_4_ + (int)sVar3;
    uVar1 = apache::thrift::protocol::TProtocol::writeFieldEnd(prot);
    tracker.prot_._4_4_ = uVar1 + tracker.prot_._4_4_;
  }
  uVar1 = apache::thrift::protocol::TProtocol::writeFieldStop(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeStructEnd(prot);
  uVar2 = uVar1 + tracker.prot_._4_4_;
  tracker.prot_._4_4_ = uVar2;
  apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker(&local_28);
  return (ulong)uVar2;
}

Assistant:

uint32_t Annotation::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("Annotation");

  xfer += oprot->writeFieldBegin("timestamp", ::apache::thrift::protocol::T_I64, 1);
  xfer += oprot->writeI64(this->timestamp);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("value", ::apache::thrift::protocol::T_STRING, 2);
  xfer += oprot->writeString(this->value);
  xfer += oprot->writeFieldEnd();

  if (this->__isset.host) {
    xfer += oprot->writeFieldBegin("host", ::apache::thrift::protocol::T_STRUCT, 3);
    xfer += this->host.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}